

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O1

void __thiscall icu_63::UVector64::setSize(UVector64 *this,int32_t newSize)

{
  uint uVar1;
  UBool UVar2;
  uint in_EAX;
  UErrorCode ec;
  undefined8 uStack_18;
  
  if (-1 < newSize) {
    if (this->count < newSize) {
      uStack_18 = (ulong)in_EAX;
      if ((this->capacity < newSize) &&
         (UVar2 = expandCapacity(this,newSize,(UErrorCode *)((long)&uStack_18 + 4)), UVar2 == '\0'))
      {
        return;
      }
      uVar1 = this->count;
      if ((int)uVar1 < newSize) {
        memset(this->elements + (int)uVar1,0,(ulong)(~uVar1 + newSize) * 8 + 8);
      }
    }
    this->count = newSize;
  }
  return;
}

Assistant:

void UVector64::setSize(int32_t newSize) {
    int32_t i;
    if (newSize < 0) {
        return;
    }
    if (newSize > count) {
        UErrorCode ec = U_ZERO_ERROR;
        if (!ensureCapacity(newSize, ec)) {
            return;
        }
        for (i=count; i<newSize; ++i) {
            elements[i] = 0;
        }
    } 
    count = newSize;
}